

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O1

bool __thiscall embree::TokenStream::tryFloat(TokenStream *this,Token *token,ParseLocation *loc)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Stream<int> *pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int *piVar6;
  double dVar7;
  string str;
  undefined1 local_98 [8];
  char *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_70 [16];
  ssize_t local_60;
  ssize_t sStack_58;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_98 = (undefined1  [8])&local_88;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"nan","");
  bVar5 = trySymbol(this,(string *)local_98);
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98);
  }
  if (bVar5) {
    local_98 = (undefined1  [8])0x7fc0000000000003;
  }
  else {
    local_98 = (undefined1  [8])&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"+inf","");
    bVar5 = trySymbol(this,(string *)local_98);
    if (local_98 != (undefined1  [8])&local_88) {
      operator_delete((void *)local_98);
    }
    if (bVar5) {
      local_98 = (undefined1  [8])0x7f80000000000003;
    }
    else {
      local_98 = (undefined1  [8])&local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"-inf","");
      bVar5 = trySymbol(this,(string *)local_98);
      if (local_98 != (undefined1  [8])&local_88) {
        operator_delete((void *)local_98);
      }
      if (!bVar5) {
        bVar5 = decDigits(this,&local_50);
        pSVar2 = (this->cin).ptr;
        if (bVar5) {
          piVar6 = Stream<int>::peek(pSVar2);
          pSVar2 = (this->cin).ptr;
          if (*piVar6 == 0x2e) {
            Stream<int>::get(pSVar2);
            std::__cxx11::string::push_back((char)&local_50);
            decDigits(this,&local_50);
            piVar6 = Stream<int>::peek((this->cin).ptr);
            if (*piVar6 != 0x65) {
              piVar6 = Stream<int>::peek((this->cin).ptr);
LAB_001da540:
              bVar5 = true;
              if (*piVar6 != 0x45) goto LAB_001da58b;
            }
          }
          else {
            piVar6 = Stream<int>::peek(pSVar2);
            if ((*piVar6 != 0x65) && (piVar6 = Stream<int>::peek((this->cin).ptr), *piVar6 != 0x45))
            goto LAB_001da589;
          }
LAB_001da562:
          Stream<int>::get((this->cin).ptr);
          std::__cxx11::string::push_back((char)&local_50);
          bVar5 = decDigits(this,&local_50);
        }
        else {
          piVar6 = Stream<int>::peek(pSVar2);
          if (*piVar6 == 0x2e) {
            Stream<int>::get((this->cin).ptr);
            std::__cxx11::string::push_back((char)&local_50);
            bVar5 = decDigits(this,&local_50);
            if (bVar5) {
              piVar6 = Stream<int>::peek((this->cin).ptr);
              if (*piVar6 != 0x65) {
                piVar6 = Stream<int>::peek((this->cin).ptr);
                goto LAB_001da540;
              }
              goto LAB_001da562;
            }
          }
LAB_001da589:
          bVar5 = false;
        }
LAB_001da58b:
        if (bVar5 == false) {
          Stream<int>::unget((this->cin).ptr,local_50._M_string_length);
        }
        else {
          dVar7 = atof(local_50._M_dataplus._M_p);
          local_98._4_4_ = (float)dVar7;
          local_98._0_4_ = 3;
          local_88._M_allocated_capacity = 0;
          local_88._M_local_buf[8] = '\0';
          local_70._0_8_ =
               (loc->fileName).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_70._8_8_ =
               (loc->fileName).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count +
                   1;
            }
          }
          local_60 = loc->lineNumber;
          sStack_58 = loc->colNumber;
          token->ty = 3;
          token->field_1 = (anon_union_4_3_4e90a026_for_Token_2)(float)dVar7;
          local_90 = local_88._M_local_buf + 8;
          std::__cxx11::string::operator=((string *)&token->str,(string *)&local_90);
          uVar4 = local_70._8_8_;
          uVar3 = local_70._0_8_;
          local_70 = ZEXT816(0);
          p_Var1 = (token->loc).fileName.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (token->loc).fileName.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar3;
          (token->loc).fileName.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          (token->loc).lineNumber = local_60;
          (token->loc).colNumber = sStack_58;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
          }
          if (local_90 != local_88._M_local_buf + 8) {
            operator_delete(local_90);
          }
        }
        goto LAB_001da475;
      }
      local_98 = (undefined1  [8])0xff80000000000003;
    }
  }
  sStack_58 = -1;
  local_60 = -1;
  local_88._M_allocated_capacity = 0;
  local_88._M_local_buf[8] = '\0';
  local_70 = (undefined1  [16])0x0;
  *(undefined1 (*) [8])token = local_98;
  local_90 = local_88._M_local_buf + 8;
  std::__cxx11::string::operator=((string *)&token->str,(string *)&local_90);
  uVar3 = local_70._0_8_;
  uVar4 = local_70._8_8_;
  local_70 = ZEXT816(0);
  p_Var1 = (token->loc).fileName.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (token->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)uVar3;
  (token->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (token->loc).lineNumber = local_60;
  (token->loc).colNumber = sStack_58;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if (local_90 != local_88._M_local_buf + 8) {
    operator_delete(local_90);
  }
  bVar5 = true;
LAB_001da475:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar5;
}

Assistant:

bool TokenStream::tryFloat(Token& token, const ParseLocation& loc)
  {
    bool ok = false;
    std::string str;
    if (trySymbol("nan")) {
      token = Token(float(nan));
      return true;
    }
    if (trySymbol("+inf")) {
      token = Token(float(pos_inf));
      return true;
    }
    if (trySymbol("-inf")) {
      token = Token(float(neg_inf));
      return true;
    }

    if (decDigits(str))
    {
      if (cin->peek() == '.') {
        str += (char)cin->get();
        decDigits(str);
        if (cin->peek() == 'e' || cin->peek() == 'E') {
          str += (char)cin->get();
          if (decDigits(str)) ok = true; // 1.[2]E2
        }
        else ok = true; // 1.[2]
      }
      else if (cin->peek() == 'e' || cin->peek() == 'E') {
        str += (char)cin->get();
        if (decDigits(str)) ok = true; // 1E2
      }
    }
    else
    {
      if (cin->peek() == '.') {
        str += (char)cin->get();
        if (decDigits(str)) {
          if (cin->peek() == 'e' || cin->peek() == 'E') {
            str += (char)cin->get();
            if (decDigits(str)) ok = true; // .3E2
          }
          else ok = true; // .3
        }
      }
    }
    if (ok) {
      token = Token((float)atof(str.c_str()),loc);
    }
    else cin->unget(str.size());
    return ok;
  }